

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<ProKey,QSet<ProKey>>::tryEmplace_impl<ProKey_const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,ProKey *key)

{
  uchar uVar1;
  Span *pSVar2;
  Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> *pDVar3;
  size_t sVar4;
  Node<ProKey,_QSet<ProKey>_> *this_00;
  ulong uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  Bucket BVar9;
  Bucket BVar10;
  QHash<ProKey,_QSet<ProKey>_> local_40;
  long local_38;
  Span *pSVar5;
  ulong uVar6;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = *this;
  if (pDVar3 == (Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> *)0x0) {
    pDVar3 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_>::detached
                       ((Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> *)0x0);
    *(Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> **)this = pDVar3;
  }
  local_40.d = (Data *)0x0;
  uVar7 = pDVar3->seed;
  sVar4 = qHash(&key->super_ProString);
  uVar7 = sVar4 ^ uVar7;
  BVar9 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_>::findBucketWithHash<ProKey>
                    (*this,key,uVar7);
  uVar6 = BVar9.index;
  pSVar5 = BVar9.span;
  uVar1 = pSVar5->offsets[uVar6];
  pDVar3 = *this;
  if ((pDVar3 == (Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> *)0x0) ||
     (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    QHash<ProKey,_QSet<ProKey>_>::operator=(&local_40,(QHash<ProKey,_QSet<ProKey>_> *)this);
    if (uVar1 == 0xff) {
LAB_002751d9:
      pDVar3 = *this;
      if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
        pDVar3 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_>::detached
                           (pDVar3,pDVar3->size + 1);
        *(Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> **)this = pDVar3;
        BVar10 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_>::
                 findBucketWithHash<ProKey>(pDVar3,key,uVar7);
        goto LAB_0027524c;
      }
    }
    else {
      pDVar3 = *this;
    }
    pSVar2 = pDVar3->spans;
    pDVar3 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_>::detached(pDVar3);
    *(Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> **)this = pDVar3;
    uVar8 = (uint)BVar9.index & 0x7f;
    BVar10.index._0_4_ = uVar8;
    BVar10.span = pDVar3->spans +
                  ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar6) >> 7);
    BVar10.index._4_4_ = 0;
    BVar9.index._0_4_ = uVar8;
    BVar9.span = pDVar3->spans +
                 ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar6) >> 7);
    BVar9.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_00275275;
  }
  else {
    if (uVar1 != 0xff) goto LAB_00275275;
    BVar10 = BVar9;
    if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
      QHash<ProKey,_QSet<ProKey>_>::operator=(&local_40,(QHash<ProKey,_QSet<ProKey>_> *)this);
      goto LAB_002751d9;
    }
  }
LAB_0027524c:
  BVar9 = BVar10;
  this_00 = QHashPrivate::Span<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_>::insert
                      (BVar9.span,BVar9.index);
  ProString::ProString((ProString *)this_00,&key->super_ProString);
  (this_00->value).q_hash.d = (Data *)0x0;
  pDVar3 = *this;
  pDVar3->size = pDVar3->size + 1;
LAB_00275275:
  pSVar5 = pDVar3->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar3;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar9.span - (long)pSVar5) >> 4) * 0x1c71c71c71c71c80 | BVar9.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<ProKey,_QSet<ProKey>_>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }